

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::DOM::SkipComments(vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> nbuffer;
  vector<char,_std::allocator<char>_> *buffer_local;
  
  nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = buffer;
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(buffer);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!buffer.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x1e9,"static bool Assimp::PLY::DOM::SkipComments(std::vector<char> &)");
  }
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30,
             (vector<char,_std::allocator<char>_> *)
             nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
  bVar1 = SkipSpaces((vector<char,_std::allocator<char>_> *)local_30);
  if (bVar1) {
    bVar1 = TokenMatch((vector<char,_std::allocator<char>_> *)local_30,"comment",7);
    if (bVar1) {
      bVar1 = SkipSpaces((vector<char,_std::allocator<char>_> *)local_30);
      if (!bVar1) {
        SkipLine((vector<char,_std::allocator<char>_> *)local_30);
      }
      bVar1 = TokenMatch((vector<char,_std::allocator<char>_> *)local_30,"TextureFile",0xb);
      if (bVar1) {
        buffer_local._7_1_ = true;
      }
      else {
        SkipLine((vector<char,_std::allocator<char>_> *)local_30);
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)
                   nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                   (vector<char,_std::allocator<char>_> *)local_30);
        buffer_local._7_1_ = true;
      }
    }
    else {
      buffer_local._7_1_ = false;
    }
  }
  else {
    buffer_local._7_1_ = false;
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return buffer_local._7_1_;
}

Assistant:

bool PLY::DOM::SkipComments(std::vector<char> &buffer)
{
  ai_assert(!buffer.empty());

  std::vector<char> nbuffer = buffer;
  // skip spaces
  if (!SkipSpaces(nbuffer)) {
    return false;
  }

  if (TokenMatch(nbuffer, "comment", 7))
  {
    if (!SkipSpaces(nbuffer))
      SkipLine(nbuffer);

    if (!TokenMatch(nbuffer, "TextureFile", 11))
    {
      SkipLine(nbuffer);
      buffer = nbuffer;
      return true;
    }

    return true;
  }

  return false;
}